

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Node * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
::CloneFromOther(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                 *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                       *other)

{
  Node *pNVar1;
  NodeBase *pNVar2;
  uint uVar3;
  ulong uVar4;
  Node *pNVar5;
  
  uVar3 = (other->
          super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_UntypedMapBase.index_of_first_non_null_;
  uVar4 = (ulong)uVar3;
  if (uVar3 == (other->
               super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).super_UntypedMapBase.num_buckets_) {
    return (Node *)0x0;
  }
  pNVar2 = (other->
           super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super_UntypedMapBase.table_[uVar4];
  if (pNVar2 != (NodeBase *)0x0) {
    pNVar5 = (Node *)0x0;
    do {
      do {
        pNVar1 = (Node *)protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
        Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
                  (&(pNVar1->kv).first,
                   (this->
                   super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).super_UntypedMapBase.arena_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pNVar2 + 1)
                  );
        (pNVar1->kv).second = *(Proto2MapEnum *)&pNVar2[5].next;
        (pNVar1->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar5;
        pNVar2 = pNVar2->next;
        pNVar5 = pNVar1;
      } while (pNVar2 != (NodeBase *)0x0);
      do {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        if ((other->
            super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_UntypedMapBase.num_buckets_ <= uVar3) {
          return pNVar1;
        }
        pNVar2 = (other->
                 super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_UntypedMapBase.table_[uVar3];
      } while (pNVar2 == (NodeBase *)0x0);
    } while( true );
  }
  protobuf::internal::protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }